

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

void __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::QuadMv<4>_>,_embree::avx::CalculateMeshBounds<embree::QuadMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::QuadMv<4>_>,_embree::avx::CalculateMeshBounds<embree::QuadMesh>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  BuildPrim *pBVar1;
  BuildPrim *pBVar2;
  uint uVar3;
  QuadMesh *pQVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  char cVar14;
  runtime_error *prVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  size_t i;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vfloat4 lower;
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  task_group_context context;
  auto_partitioner local_169;
  range<unsigned_int> local_168;
  size_type sStack_160;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::QuadMv<4>_>,_embree::avx::CalculateMeshBounds<embree::QuadMesh>,_embree::Scene::BuildProgressMonitorInterface>
  *local_150;
  undefined8 local_148;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  anon_class_8_1_898bcfc2 local_128;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::QuadMv<4>_>,_embree::avx::CalculateMeshBounds<embree::QuadMesh>,_embree::Scene::BuildProgressMonitorInterface>
  **local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_e8;
  task_group_context local_d8;
  blocked_range<unsigned_int> local_58;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_108._8_8_ = local_108._0_8_;
  uVar16 = current->_begin;
  uVar19 = (ulong)uVar16;
  uVar3 = current->_end;
  if (uVar3 - uVar16 < 0x400) {
    if (uVar16 < uVar3) {
      pQVar4 = this->calculateBounds->mesh;
      lVar5 = *(long *)&(pQVar4->super_Geometry).field_0x58;
      pcVar6 = (pQVar4->vertices0).super_RawBufferView.ptr_ofs;
      sVar7 = (pQVar4->vertices0).super_RawBufferView.stride;
      auVar20._8_4_ = 0x7f800000;
      auVar20._0_8_ = 0x7f8000007f800000;
      auVar20._12_4_ = 0x7f800000;
      auVar22._8_4_ = 0xff800000;
      auVar22._0_8_ = 0xff800000ff800000;
      auVar22._12_4_ = 0xff800000;
      uVar17 = uVar19;
      do {
        lVar18 = (ulong)this->morton[uVar17].field_0.field_0.index * *(long *)&pQVar4->field_0x68;
        auVar8 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + lVar18) * sVar7),
                            *(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 4 + lVar18) * sVar7));
        auVar9 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 8 + lVar18) * sVar7),
                            *(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 0xc + lVar18) * sVar7)
                           );
        auVar21 = vminps_avx(auVar8,auVar9);
        auVar8 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + lVar18) * sVar7),
                            *(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 4 + lVar18) * sVar7));
        auVar9 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 8 + lVar18) * sVar7),
                            *(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 0xc + lVar18) * sVar7)
                           );
        auVar8 = vmaxps_avx(auVar8,auVar9);
        auVar26._0_4_ = auVar21._0_4_ + auVar8._0_4_;
        auVar26._4_4_ = auVar21._4_4_ + auVar8._4_4_;
        auVar26._8_4_ = auVar21._8_4_ + auVar8._8_4_;
        auVar26._12_4_ = auVar21._12_4_ + auVar8._12_4_;
        auVar20 = vminps_avx(auVar20,auVar26);
        auVar22 = vmaxps_avx(auVar22,auVar26);
        uVar17 = uVar17 + 1;
      } while (uVar3 != uVar17);
    }
    else {
      auVar22._8_4_ = 0xff800000;
      auVar22._0_8_ = 0xff800000ff800000;
      auVar22._12_4_ = 0xff800000;
      auVar20._8_4_ = 0x7f800000;
      auVar20._0_8_ = 0x7f8000007f800000;
      auVar20._12_4_ = 0x7f800000;
    }
    uVar17 = (ulong)current->_end;
    if (uVar16 < current->_end) {
      auVar21 = vsubps_avx(auVar22,auVar20);
      auVar27._8_4_ = 0x1fec1e4a;
      auVar27._0_8_ = 0x1fec1e4a1fec1e4a;
      auVar27._12_4_ = 0x1fec1e4a;
      auVar8 = vcmpps_avx(auVar21,auVar27,6);
      auVar9 = vrcpps_avx(auVar21);
      fVar10 = auVar9._0_4_;
      auVar23._0_4_ = auVar21._0_4_ * fVar10;
      fVar11 = auVar9._4_4_;
      auVar23._4_4_ = auVar21._4_4_ * fVar11;
      fVar12 = auVar9._8_4_;
      auVar23._8_4_ = auVar21._8_4_ * fVar12;
      fVar13 = auVar9._12_4_;
      auVar23._12_4_ = auVar21._12_4_ * fVar13;
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = &DAT_3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar9 = vsubps_avx(auVar31,auVar23);
      auVar24._0_4_ = (fVar10 + fVar10 * auVar9._0_4_) * 1013.76;
      auVar24._4_4_ = (fVar11 + fVar11 * auVar9._4_4_) * 1013.76;
      auVar24._8_4_ = (fVar12 + fVar12 * auVar9._8_4_) * 1013.76;
      auVar24._12_4_ = (fVar13 + fVar13 * auVar9._12_4_) * 1013.76;
      auVar8 = vandps_avx(auVar8,auVar24);
      auVar28._8_4_ = 0x30000ff;
      auVar28._0_8_ = 0x30000ff030000ff;
      auVar28._12_4_ = 0x30000ff;
      auVar29._8_4_ = 0x300f00f;
      auVar29._0_8_ = 0x300f00f0300f00f;
      auVar29._12_4_ = 0x300f00f;
      auVar32._8_4_ = 0x30c30c3;
      auVar32._0_8_ = 0x30c30c3030c30c3;
      auVar32._12_4_ = 0x30c30c3;
      auVar9 = vpmovsxbd_avx(ZEXT416(0x1405));
      do {
        pQVar4 = this->calculateBounds->mesh;
        lVar18 = (ulong)this->morton[uVar19].field_0.field_0.index * *(long *)&pQVar4->field_0x68;
        lVar5 = *(long *)&(pQVar4->super_Geometry).field_0x58;
        pcVar6 = (pQVar4->vertices0).super_RawBufferView.ptr_ofs;
        sVar7 = (pQVar4->vertices0).super_RawBufferView.stride;
        auVar21 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + lVar18) * sVar7),
                             *(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 4 + lVar18) * sVar7))
        ;
        auVar35 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 8 + lVar18) * sVar7),
                             *(undefined1 (*) [16])
                              (pcVar6 + *(uint *)(lVar5 + 0xc + lVar18) * sVar7));
        auVar25 = vminps_avx(auVar21,auVar35);
        auVar21 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + lVar18) * sVar7),
                             *(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 4 + lVar18) * sVar7))
        ;
        auVar35 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + *(uint *)(lVar5 + 8 + lVar18) * sVar7),
                             *(undefined1 (*) [16])
                              (pcVar6 + *(uint *)(lVar5 + 0xc + lVar18) * sVar7));
        auVar21 = vmaxps_avx(auVar21,auVar35);
        auVar33._0_4_ = auVar25._0_4_ + auVar21._0_4_;
        auVar33._4_4_ = auVar25._4_4_ + auVar21._4_4_;
        auVar33._8_4_ = auVar25._8_4_ + auVar21._8_4_;
        auVar33._12_4_ = auVar25._12_4_ + auVar21._12_4_;
        auVar21 = vsubps_avx(auVar33,auVar20);
        auVar34._0_4_ = auVar8._0_4_ * auVar21._0_4_;
        auVar34._4_4_ = auVar8._4_4_ * auVar21._4_4_;
        auVar34._8_4_ = auVar8._8_4_ * auVar21._8_4_;
        auVar34._12_4_ = auVar8._12_4_ * auVar21._12_4_;
        auVar21 = vcvtps2dq_avx(auVar34);
        uVar16 = vextractps_avx(auVar21,1);
        uVar16 = (uVar16 << 0x10 | uVar16) & 0x30000ff;
        uVar16 = (uVar16 << 8 | uVar16) & 0x300f00f;
        auVar21 = vshufps_avx(auVar21,auVar21,0xe8);
        auVar35 = vpslld_avx(auVar21,0x10);
        auVar21 = vpor_avx(auVar35,auVar21);
        auVar21 = vpand_avx(auVar21,auVar28);
        auVar35 = vpslld_avx(auVar21,8);
        auVar21 = vpor_avx(auVar35,auVar21);
        auVar21 = vpand_avx(auVar21,auVar29);
        auVar35 = vpslld_avx(auVar21,4);
        auVar21 = vpor_avx(auVar35,auVar21);
        auVar21 = vpand_avx(auVar21,auVar32);
        auVar21 = vpmulld_avx(auVar21,auVar9);
        auVar21 = vpand_avx(auVar21,ZEXT816(0x2492492409249249));
        this->morton[uVar19].field_0.field_0.code =
             auVar21._4_4_ | auVar21._0_4_ | ((uVar16 << 4 | uVar16) & 0x30c30c3) * 10 & 0x12492492;
        uVar19 = uVar19 + 1;
        uVar17 = (ulong)current->_end;
      } while (uVar19 < uVar17);
    }
    uVar16 = current->_begin;
    if (uVar16 != (uint)uVar17) {
      pBVar1 = this->morton + uVar17;
      pBVar2 = this->morton + uVar16;
      uVar19 = (long)(uVar17 * 8 + (ulong)uVar16 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<embree::avx::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::avx::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1);
      return;
    }
  }
  else {
    local_58.my_end = 0x7f800000;
    local_58.my_begin = 0x7f800000;
    local_58.my_grainsize = 0x7f8000007f800000;
    uStack_48 = 0xff800000;
    uStack_44 = 0xff800000;
    uStack_40 = 0xff800000;
    uStack_3c = 0xff800000;
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node = (intrusive_list_node)ZEXT816(0);
    local_d8.my_name = CUSTOM_CTX;
    local_150 = this;
    tbb::detail::r1::initialize(&local_d8);
    local_148._4_4_ = uVar16;
    local_148._0_4_ = uVar3;
    local_140 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)0x400;
    local_128.func = (anon_class_16_2_00173b7b *)BBox<embree::Vec3fa>::merge;
    local_120 = &local_150;
    local_118._8_8_ = &local_128;
    local_118._0_8_ = &local_58;
    local_108._0_8_ = BBox<embree::Vec3fa>::merge;
    aStack_e8._0_8_ = CONCAT44(uStack_44,uStack_48);
    aStack_e8._8_8_ = CONCAT44(uStack_3c,uStack_40);
    local_f8.m128[0] = (float)local_58.my_end;
    local_f8.m128[1] = (float)local_58.my_begin;
    local_f8._8_8_ = local_58.my_grainsize;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_148,
          (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
           *)local_118,&local_169,&local_d8);
    local_168._begin = (uint)local_f8.m128[0];
    local_168._end = (uint)local_f8.m128[1];
    sStack_160 = local_f8._8_8_;
    local_138 = aStack_e8._0_8_;
    uStack_130 = aStack_e8._8_8_;
    cVar14 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar14 != '\0') {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar15,"task cancelled");
      __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    local_118._8_8_ = sStack_160;
    local_118._0_4_ = local_168._begin;
    local_118._4_4_ = local_168._end;
    auVar9._8_8_ = uStack_130;
    auVar9._0_8_ = local_138;
    auVar21 = vsubps_avx(auVar9,local_118);
    auVar25._8_4_ = 0x1fec1e4a;
    auVar25._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar25._12_4_ = 0x1fec1e4a;
    auVar8 = vcmpps_avx(auVar21,auVar25,6);
    auVar9 = vrcpps_avx(auVar21);
    fVar10 = auVar9._0_4_;
    auVar35._0_4_ = auVar21._0_4_ * fVar10;
    fVar11 = auVar9._4_4_;
    auVar35._4_4_ = auVar21._4_4_ * fVar11;
    fVar12 = auVar9._8_4_;
    auVar35._8_4_ = auVar21._8_4_ * fVar12;
    fVar13 = auVar9._12_4_;
    auVar35._12_4_ = auVar21._12_4_ * fVar13;
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = &DAT_3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar30,auVar35);
    auVar21._0_4_ = (fVar10 + fVar10 * auVar9._0_4_) * 1013.76;
    auVar21._4_4_ = (fVar11 + fVar11 * auVar9._4_4_) * 1013.76;
    auVar21._8_4_ = (fVar12 + fVar12 * auVar9._8_4_) * 1013.76;
    auVar21._12_4_ = (fVar13 + fVar13 * auVar9._12_4_) * 1013.76;
    local_108 = vandps_avx(auVar8,auVar21);
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_d8.my_name = CUSTOM_CTX;
    local_168 = *current;
    sStack_160 = 0;
    local_148 = this;
    local_140 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)local_118;
    tbb::detail::r1::initialize(&local_d8);
    auVar8._8_8_ = sStack_160;
    auVar8._0_4_ = local_168._begin;
    auVar8._4_4_ = local_168._end;
    auVar8 = vpermilps_avx(auVar8,0xe1);
    local_58._0_8_ = vmovlps_avx(auVar8);
    local_58.my_grainsize = 0x400;
    local_128.func = (anon_class_16_2_00173b7b *)&local_148;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_58,&local_128,&local_169,&local_d8);
    cVar14 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar14 != '\0') {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar15,"task cancelled");
      __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    tbb::detail::d1::
    parallel_sort<embree::avx::BVHBuilderMorton::BuildPrim*,std::less<embree::avx::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::avx::BVHBuilderMorton::BuildPrim> *)&local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }